

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_head_multiple.h
# Opt level: O0

void __thiscall
density::detail::
LFQueue_Head<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
::Consume::start_consume_impl
          (Consume *this,
          LFQueue_Head<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
          *i_queue)

{
  bool bVar1;
  LFQueue_Head<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
  *i_queue_local;
  Consume *this_local;
  
  bVar1 = empty(this);
  if (!bVar1) {
    density_tests::detail::assert_failed<>
              ("empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_head_multiple.h"
               ,0xf7);
  }
  begin_iteration(this,i_queue);
  do {
    while( true ) {
      bVar1 = empty(this);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        return;
      }
      if ((this->m_next_ptr & 0xb) != 0) break;
      bVar1 = raw_atomic_compare_exchange_strong
                        (&this->m_control->m_next,&this->m_next_ptr,this->m_next_ptr | 1,
                         memory_order_seq_cst,memory_order_seq_cst);
      if (bVar1) {
        this->m_next_ptr = this->m_next_ptr | 2;
        return;
      }
      bVar1 = empty(this);
      if (!bVar1) goto LAB_0260e695;
      begin_iteration(this,i_queue);
    }
    if ((this->m_next_ptr & 3) == 2) {
      advance_head(this);
    }
LAB_0260e695:
    move_next(this);
  } while( true );
}

Assistant:

void start_consume_impl(LFQueue_Head * i_queue) noexcept
                {
                    DENSITY_ASSERT_INTERNAL(empty());

                    begin_iteration(i_queue);
                    while (!empty())
                    {
                        if (
                          (m_next_ptr & (LfQueue_Busy | LfQueue_Dead | LfQueue_InvalidNextPage)) ==
                          0)
                        {
                            /* We try to set the flag LfQueue_Busy on it */
                            if (raw_atomic_compare_exchange_strong(
                                  &m_control->m_next,
                                  &m_next_ptr,
                                  m_next_ptr | LfQueue_Busy,
                                  mem_acquire,
                                  mem_relaxed))
                            {
                                m_next_ptr |= LfQueue_Dead;
                                break;
                            }
                            else
                            {
                                if (empty())
                                {
                                    begin_iteration(i_queue);
                                    continue;
                                }
                            }
                        }
                        else if ((m_next_ptr & (LfQueue_Busy | LfQueue_Dead)) == LfQueue_Dead)
                        {
                            advance_head();
                        }
                        move_next();
                    }
                }